

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

const_iterator __thiscall
duckdb::ModeState<int,_duckdb::ModeStandard<int>_>::Scan
          (ModeState<int,_duckdb::ModeStandard<int>_> *this)

{
  __node_type *p_Var1;
  ulong uVar2;
  ulong uVar3;
  _Node_iterator_base<std::pair<const_int,_duckdb::ModeAttr>,_false> _Var4;
  
  p_Var1 = (__node_type *)(this->frequency_map->_M_h)._M_before_begin._M_nxt;
  _Var4._M_cur = p_Var1;
  for (; p_Var1 != (__node_type *)0x0;
      p_Var1 = (__node_type *)(p_Var1->super__Hash_node_base)._M_nxt) {
    uVar2 = *(ulong *)((long)&((_Var4._M_cur)->
                              super__Hash_node_value<std::pair<const_int,_duckdb::ModeAttr>,_false>)
                              .super__Hash_node_value_base<std::pair<const_int,_duckdb::ModeAttr>_>.
                              _M_storage._M_storage + 8);
    uVar3 = *(ulong *)((long)&(p_Var1->
                              super__Hash_node_value<std::pair<const_int,_duckdb::ModeAttr>,_false>)
                              .super__Hash_node_value_base<std::pair<const_int,_duckdb::ModeAttr>_>.
                              _M_storage._M_storage + 8);
    if ((uVar2 < uVar3) ||
       ((uVar3 == uVar2 &&
        (*(ulong *)((long)&(p_Var1->
                           super__Hash_node_value<std::pair<const_int,_duckdb::ModeAttr>,_false>).
                           super__Hash_node_value_base<std::pair<const_int,_duckdb::ModeAttr>_>.
                           _M_storage._M_storage + 0x10) <
         *(ulong *)((long)&((_Var4._M_cur)->
                           super__Hash_node_value<std::pair<const_int,_duckdb::ModeAttr>,_false>).
                           super__Hash_node_value_base<std::pair<const_int,_duckdb::ModeAttr>_>.
                           _M_storage._M_storage + 0x10))))) {
      _Var4._M_cur = p_Var1;
    }
  }
  return (const_iterator)
         (_Node_iterator_base<std::pair<const_int,_duckdb::ModeAttr>,_false>)_Var4._M_cur;
}

Assistant:

typename Counts::const_iterator Scan() const {
		//! Initialize control variables to first variable of the frequency map
		auto highest_frequency = frequency_map->begin();
		for (auto i = highest_frequency; i != frequency_map->end(); ++i) {
			// Tie break with the lowest insert position
			if (i->second.count > highest_frequency->second.count ||
			    (i->second.count == highest_frequency->second.count &&
			     i->second.first_row < highest_frequency->second.first_row)) {
				highest_frequency = i;
			}
		}
		return highest_frequency;
	}